

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

ImageT<unsigned_char,_2U> * __thiscall
ImageT<unsigned_char,2u>::copyTo<ImageT<unsigned_char,3u>>
          (ImageT<unsigned_char,2u> *this,ImageT<unsigned_char,_3U> *dst,string_view swizzle)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  Color *pCVar4;
  uchar uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong local_48;
  long local_40;
  
  iVar6 = (**(code **)(*(long *)this + 0x30))(this,dst,swizzle._M_len);
  iVar7 = (*(dst->super_Image)._vptr_Image[6])(dst);
  if (iVar6 != iVar7) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned char, 2>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 2, DstImage = ImageT<unsigned char, 3>]"
                 );
  }
  uVar1 = *(uint32_t *)(this + 8);
  if ((uVar1 != (dst->super_Image).width) ||
     (uVar2 = *(uint32_t *)(this + 0xc), uVar2 != (dst->super_Image).height)) {
    __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50b,
                  "ImageT<componentType, componentCount> &ImageT<unsigned char, 2>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 2, DstImage = ImageT<unsigned char, 3>]"
                 );
  }
  uVar3 = *(undefined8 *)(this + 0x10);
  (dst->super_Image).transferFunction = (int)uVar3;
  (dst->super_Image).primaries = (int)((ulong)uVar3 >> 0x20);
  if (uVar2 * uVar1 != 0) {
    local_40 = 0;
    local_48 = 0;
    do {
      iVar6 = (*(dst->super_Image)._vptr_Image[5])(dst);
      uVar10 = 0;
      if (iVar6 != 0) {
        uVar10 = 0;
        do {
          uVar8 = (**(code **)(*(long *)this + 0x28))(this);
          if (uVar8 <= uVar10) break;
          pCVar4 = dst->pixels;
          uVar5 = ImageT<unsigned_char,_2U>::swizzlePixel
                            ((ImageT<unsigned_char,_2U> *)this,
                             (Color *)(*(long *)(this + 0x18) + local_48 * 2),swizzle._M_str[uVar10]
                            );
          uVar9 = 2;
          if ((uint)uVar10 < 2) {
            uVar9 = uVar10 & 0xffffffff;
          }
          pCVar4[local_48].field_0.comps[uVar9] = uVar5;
          uVar10 = uVar10 + 1;
          uVar8 = (*(dst->super_Image)._vptr_Image[5])(dst);
        } while (uVar10 < uVar8);
      }
      uVar8 = (*(dst->super_Image)._vptr_Image[5])(dst);
      if ((uint)uVar10 < uVar8) {
        uVar10 = uVar10 & 0xffffffff;
        do {
          if (uVar10 < 3) {
            (dst->pixels->field_0).comps[uVar10 + local_40] = '\0';
          }
          else {
            dst->pixels[local_48].field_0.comps[2] = 0xff;
          }
          uVar10 = uVar10 + 1;
          uVar8 = (*(dst->super_Image)._vptr_Image[5])(dst);
        } while (uVar10 < uVar8);
      }
      local_48 = local_48 + 1;
      local_40 = local_40 + 3;
    } while (local_48 < (uint)(*(int *)(this + 0xc) * *(int *)(this + 8)));
  }
  return (ImageT<unsigned_char,_2U> *)this;
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }